

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O2

uchar * rans_compress_O0(uchar *in,uint in_size,uint *out_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint32_t freq;
  undefined1 auVar5 [16];
  ulong uVar6;
  uchar *puVar7;
  long lVar8;
  byte *pbVar9;
  int iVar10;
  size_t __n;
  uint uVar11;
  byte *pbVar12;
  uint32_t start;
  undefined4 in_register_00000034;
  ulong uVar13;
  int iVar14;
  int iVar15;
  byte *pbVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  RansState rans2;
  RansState rans1;
  RansState rans0;
  uchar *local_1470;
  uchar *local_1468;
  RansState rans3;
  uchar *local_1458;
  ulong local_1450;
  uchar *local_1448;
  uint *local_1440;
  int F [256];
  RansEncSymbol syms [256];
  
  local_1450 = CONCAT44(in_register_00000034,in_size);
  uVar13 = CONCAT44(0,in_size);
  local_1458 = (uchar *)((double)uVar13 * 1.05);
  dVar19 = (double)local_1458 + 198147.0 + 9.0;
  uVar6 = (ulong)dVar19;
  local_1470 = in;
  puVar7 = (uchar *)malloc((long)(dVar19 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
  memset(F,0,0x400);
  if (puVar7 != (uchar *)0x0) {
    local_1468 = puVar7 + (long)(int)(double)local_1458 + 0x3060c;
    for (uVar6 = 0; uVar13 != uVar6; uVar6 = uVar6 + 1) {
      F[local_1470[uVar6]] = F[local_1470[uVar6]] + 1;
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar13;
    iVar15 = 0;
    iVar10 = 0;
    uVar6 = 0;
    for (uVar13 = 0; uVar13 != 0x100; uVar13 = uVar13 + 1) {
      iVar4 = F[uVar13];
      if ((long)iVar4 != 0) {
        iVar14 = iVar10;
        if (iVar10 <= iVar4) {
          iVar14 = iVar4;
        }
        if (iVar10 < iVar4) {
          uVar6 = uVar13 & 0xffffffff;
        }
        uVar11 = (uint)((long)iVar4 *
                        (0x40000000 / (local_1450 & 0xffffffff) +
                        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x80000000000)) / auVar5,0)) >> 0x1f);
        if (uVar11 < 2) {
          uVar11 = 1;
        }
        F[uVar13] = uVar11;
        iVar15 = uVar11 + iVar15;
        iVar10 = iVar14;
      }
    }
    iVar10 = (F[(int)uVar6] - iVar15) + 0xfff;
    F[(int)uVar6] = iVar10;
    local_1448 = local_1468;
    local_1440 = out_size;
    if (iVar10 < 1) {
      __assert_fail("F[M]>0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                    ,0x6d,
                    "unsigned char *rans_compress_O0(unsigned char *, unsigned int, unsigned int *)"
                   );
    }
    pbVar16 = puVar7 + 9;
    lVar18 = 1;
    start = 0;
    iVar10 = 0;
    local_1458 = puVar7;
    for (lVar17 = 0; puVar7 = local_1458, lVar17 != 0x100; lVar17 = lVar17 + 1) {
      if (F[lVar17] != 0) {
        if (iVar10 == 0) {
          *pbVar16 = (byte)lVar17;
          pbVar12 = pbVar16 + 1;
          iVar10 = 0;
          if ((lVar17 != 0) && (lVar8 = lVar18, iVar10 = 0, F[lVar17 + -1] != 0)) {
            for (; lVar8 != 0x100; lVar8 = lVar8 + 1) {
              if (F[lVar8] == 0) goto LAB_0012d89d;
            }
            lVar8 = 0x100;
LAB_0012d89d:
            iVar10 = ~(uint)lVar17 + (int)lVar8;
            pbVar16[1] = (byte)iVar10;
            pbVar12 = pbVar16 + 2;
          }
        }
        else {
          iVar10 = iVar10 + -1;
          pbVar12 = pbVar16;
        }
        iVar15 = F[lVar17];
        if (iVar15 < 0x80) {
          lVar8 = 1;
          pbVar9 = pbVar12;
        }
        else {
          pbVar9 = pbVar12 + 1;
          *pbVar12 = (byte)((uint)iVar15 >> 8) | 0x80;
          iVar15 = F[lVar17];
          lVar8 = 2;
        }
        pbVar16 = pbVar12 + lVar8;
        *pbVar9 = (byte)iVar15;
        freq = F[lVar17];
        RansEncSymbolInit(syms + lVar17,start,freq,(uint32_t)pbVar9);
        start = start + freq;
      }
      lVar18 = lVar18 + 1;
    }
    *pbVar16 = 0;
    rans0 = 0x800000;
    rans1 = 0x800000;
    rans2 = 0x800000;
    rans3 = 0x800000;
    uVar11 = (uint)local_1450;
    switch(uVar11 & 3) {
    case 0:
      break;
    case 3:
      RansEncPutSymbol(&rans2,&local_1468,syms + local_1470[uVar11 - 1]);
    case 2:
      RansEncPutSymbol(&rans1,&local_1468,syms + local_1470[(uVar11 - (uVar11 & 3)) + 1]);
    case 1:
      RansEncPutSymbol(&rans0,&local_1468,syms + local_1470[uVar11 & 0xfffffffc]);
    }
    pbVar16 = pbVar16 + (1 - (long)puVar7);
    for (lVar18 = (long)(int)(uVar11 & 0xfffffffc); puVar7 = local_1458, 0 < lVar18;
        lVar18 = lVar18 + -4) {
      bVar1 = local_1470[lVar18 + -2];
      bVar2 = local_1470[lVar18 + -3];
      bVar3 = local_1470[lVar18 + -4];
      RansEncPutSymbol(&rans3,&local_1468,syms + local_1470[lVar18 + -1]);
      RansEncPutSymbol(&rans2,&local_1468,syms + bVar1);
      RansEncPutSymbol(&rans1,&local_1468,syms + bVar2);
      RansEncPutSymbol(&rans0,&local_1468,syms + bVar3);
    }
    *(RansState *)(local_1468 + -4) = rans3;
    *(RansState *)(local_1468 + -8) = rans2;
    *(RansState *)(local_1468 + -0xc) = rans1;
    *(RansState *)(local_1468 + -0x10) = rans0;
    __n = (long)local_1448 - (long)(local_1468 + -0x10);
    uVar11 = (uint)(pbVar16 + __n);
    *local_1440 = uVar11;
    *local_1458 = '\0';
    local_1458[1] = (char)(pbVar16 + __n) + 0xf7;
    local_1458[2] = (uchar)(uVar11 + 0xfff7 >> 8);
    local_1458[3] = (uchar)(uVar11 + 0xfffff7 >> 0x10);
    local_1458[4] = (uchar)(uVar11 - 9 >> 0x18);
    local_1458[5] = (uchar)local_1450;
    local_1458[6] = (uchar)(local_1450 >> 8);
    local_1458[7] = (uchar)(local_1450 >> 0x10);
    local_1458[8] = (uchar)(local_1450 >> 0x18);
    memmove(local_1458 + (int)pbVar16,local_1468 + -0x10,__n);
  }
  return puVar7;
}

Assistant:

unsigned char *rans_compress_O0(unsigned char *in, unsigned int in_size,
				unsigned int *out_size) {
    unsigned char *out_buf = malloc(1.05*in_size + 257*257*3 + 9);
    unsigned char *cp, *out_end;
    RansEncSymbol syms[256];
    RansState rans0, rans1, rans2, rans3;
    uint8_t* ptr;
    int F[256] = {0}, i, j, tab_size, rle, x, fsum = 0;
    int m = 0, M = 0;
    uint64_t tr;

    if (!out_buf)
	return NULL;

    ptr = out_end = out_buf + (int)(1.05*in_size) + 257*257*3 + 9;

    // Compute statistics
    for (i = 0; i < in_size; i++) {
	F[in[i]]++;
    }
    tr = ((uint64_t)TOTFREQ<<31)/in_size + (1<<30)/in_size;

    // Normalise so T[i] == TOTFREQ
    for (m = M = j = 0; j < 256; j++) {
	if (!F[j])
	    continue;

	if (m < F[j])
	    m = F[j], M = j;

	if ((F[j] = (F[j]*tr)>>31) == 0)
	    F[j] = 1;
	fsum += F[j];
    }

    fsum++;
    if (fsum < TOTFREQ)
	F[M] += TOTFREQ-fsum;
    else
	F[M] -= fsum-TOTFREQ;

    //printf("F[%d]=%d\n", M, F[M]);
    assert(F[M]>0);

    // Encode statistics.
    cp = out_buf+9;

    for (x = rle = j = 0; j < 256; j++) {
	if (F[j]) {
	    // j
	    if (rle) {
		rle--;
	    } else {
		*cp++ = j;
		if (!rle && j && F[j-1])  {
		    for(rle=j+1; rle<256 && F[rle]; rle++)
			;
		    rle -= j+1;
		    *cp++ = rle;
		}
		//fprintf(stderr, "%d: %d %d\n", j, rle, N[j]);
	    }

	    // F[j]
	    if (F[j]<128) {
		*cp++ = F[j];
	    } else {
		*cp++ = 128 | (F[j]>>8);
		*cp++ = F[j]&0xff;
	    }
	    RansEncSymbolInit(&syms[j], x, F[j], TF_SHIFT);
	    x += F[j];
	}
    }
    *cp++ = 0;

    //write(1, out_buf+4, cp-(out_buf+4));
    tab_size = cp-out_buf;

    RansEncInit(&rans0);
    RansEncInit(&rans1);
    RansEncInit(&rans2);
    RansEncInit(&rans3);

    switch (i=(in_size&3)) {
    case 3: RansEncPutSymbol(&rans2, &ptr, &syms[in[in_size-(i-2)]]);
    case 2: RansEncPutSymbol(&rans1, &ptr, &syms[in[in_size-(i-1)]]);
    case 1: RansEncPutSymbol(&rans0, &ptr, &syms[in[in_size-(i-0)]]);
    case 0:
	break;
    }
    for (i=(in_size &~3); i>0; i-=4) {
	RansEncSymbol *s3 = &syms[in[i-1]];
	RansEncSymbol *s2 = &syms[in[i-2]];
	RansEncSymbol *s1 = &syms[in[i-3]];
	RansEncSymbol *s0 = &syms[in[i-4]];

	RansEncPutSymbol(&rans3, &ptr, s3);
	RansEncPutSymbol(&rans2, &ptr, s2);
	RansEncPutSymbol(&rans1, &ptr, s1);
	RansEncPutSymbol(&rans0, &ptr, s0);
    }

    RansEncFlush(&rans3, &ptr);
    RansEncFlush(&rans2, &ptr);
    RansEncFlush(&rans1, &ptr);
    RansEncFlush(&rans0, &ptr);

    // Finalise block size and return it
    *out_size = (out_end - ptr) + tab_size;

    cp = out_buf;

    *cp++ = 0; // order
    *cp++ = ((*out_size-9)>> 0) & 0xff;
    *cp++ = ((*out_size-9)>> 8) & 0xff;
    *cp++ = ((*out_size-9)>>16) & 0xff;
    *cp++ = ((*out_size-9)>>24) & 0xff;

    *cp++ = (in_size>> 0) & 0xff;
    *cp++ = (in_size>> 8) & 0xff;
    *cp++ = (in_size>>16) & 0xff;
    *cp++ = (in_size>>24) & 0xff;

    memmove(out_buf + tab_size, ptr, out_end-ptr);

    return out_buf;
}